

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doShowPages(QPDFJob *this,QPDF *pdf)

{
  size_type sVar1;
  int iVar2;
  int i;
  Pipeline *pPVar3;
  _Rb_tree_node_base *p_Var4;
  _Alloc_hider this_00;
  QPDFObjectHandle dict;
  QPDFObjectHandle page;
  QPDFObjectHandle image;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  images;
  allocator<char> local_101;
  element_type *local_100;
  int local_f4;
  QPDFPageObjectHelper *local_f0;
  QPDFObjectHandle local_e8;
  undefined1 local_d8 [32];
  QPDFJob *local_b8;
  QPDFPageObjectHelper *local_b0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a8;
  string local_98;
  undefined1 local_78 [40];
  long local_50;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_48;
  
  local_f4 = 0;
  QPDFLogger::getInfo((QPDFLogger *)local_78,
                      SUB81((((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->log).
                            super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  local_100 = (element_type *)local_78._0_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_78,pdf);
  QPDFPageDocumentHelper::getAllPages(&local_48,(QPDFPageDocumentHelper *)local_78);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_78);
  local_b0 = local_48.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_finish;
  local_b8 = this;
  while (local_48.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
         _M_impl.super__Vector_impl_data._M_start != local_b0) {
    local_f0 = local_48.
               super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
               _M_impl.super__Vector_impl_data._M_start;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x10),
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &((local_48.
                  super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                  _M_impl.super__Vector_impl_data._M_start)->super_QPDFObjectHelper).
                super_BaseHandle);
    pPVar3 = Pipeline::operator<<((Pipeline *)local_100,"page ");
    local_f4 = local_f4 + 1;
    pPVar3 = Pipeline::operator<<(pPVar3,local_f4);
    pPVar3 = Pipeline::operator<<(pPVar3,": ");
    iVar2 = QPDFObjectHandle::getObjectID((QPDFObjectHandle *)(local_d8 + 0x10));
    pPVar3 = Pipeline::operator<<(pPVar3,iVar2);
    pPVar3 = Pipeline::operator<<(pPVar3," ");
    iVar2 = QPDFObjectHandle::getGeneration((QPDFObjectHandle *)(local_d8 + 0x10));
    pPVar3 = Pipeline::operator<<(pPVar3,iVar2);
    Pipeline::operator<<(pPVar3," R\n");
    if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        show_page_images == true) {
      QPDFPageObjectHelper::getImages_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)local_78,local_f0);
      if (local_50 != 0) {
        Pipeline::operator<<((Pipeline *)local_100,"  images:\n");
        for (p_Var4 = (_Rb_tree_node_base *)local_78._24_8_;
            p_Var4 != (_Rb_tree_node_base *)(local_78 + 8);
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_a8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(p_Var4 + 2))
          ;
          QPDFObjectHandle::getDict((QPDFObjectHandle *)local_d8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"/Width",&local_101);
          QPDFObjectHandle::getKey(&local_e8,(string *)local_d8);
          iVar2 = QPDFObjectHandle::getIntValueAsInt(&local_e8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_e8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"/Height",&local_101);
          QPDFObjectHandle::getKey(&local_e8,(string *)local_d8);
          i = QPDFObjectHandle::getIntValueAsInt(&local_e8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_e8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::~string((string *)&local_98);
          pPVar3 = Pipeline::operator<<((Pipeline *)local_100,"    ");
          pPVar3 = Pipeline::operator<<(pPVar3,(string *)(p_Var4 + 1));
          pPVar3 = Pipeline::operator<<(pPVar3,": ");
          QPDFObjectHandle::unparse_abi_cxx11_(&local_98,(QPDFObjectHandle *)&local_a8);
          pPVar3 = Pipeline::operator<<(pPVar3,&local_98);
          pPVar3 = Pipeline::operator<<(pPVar3,", ");
          pPVar3 = Pipeline::operator<<(pPVar3,iVar2);
          pPVar3 = Pipeline::operator<<(pPVar3," x ");
          pPVar3 = Pipeline::operator<<(pPVar3,i);
          Pipeline::operator<<(pPVar3,"\n");
          std::__cxx11::string::~string((string *)&local_98);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                   *)local_78);
      this = local_b8;
    }
    Pipeline::operator<<((Pipeline *)local_100,"  content:\n");
    QPDFPageObjectHelper::getPageContents
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_98,local_f0);
    sVar1 = local_98._M_string_length;
    for (this_00._M_p = local_98._M_dataplus._M_p; this_00._M_p != (pointer)sVar1;
        this_00._M_p = this_00._M_p + 0x10) {
      pPVar3 = Pipeline::operator<<((Pipeline *)local_100,"    ");
      QPDFObjectHandle::unparse_abi_cxx11_((string *)local_78,(QPDFObjectHandle *)this_00._M_p);
      pPVar3 = Pipeline::operator<<(pPVar3,(string *)local_78);
      Pipeline::operator<<(pPVar3,"\n");
      std::__cxx11::string::~string((string *)local_78);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x18));
    local_48.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
    .super__Vector_impl_data._M_start = local_f0 + 1;
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_48);
  return;
}

Assistant:

void
QPDFJob::doShowPages(QPDF& pdf)
{
    int pageno = 0;
    auto& cout = *m->log->getInfo();
    for (auto& ph: QPDFPageDocumentHelper(pdf).getAllPages()) {
        QPDFObjectHandle page = ph.getObjectHandle();
        ++pageno;

        cout << "page " << pageno << ": " << page.getObjectID() << " " << page.getGeneration()
             << " R\n";
        if (m->show_page_images) {
            std::map<std::string, QPDFObjectHandle> images = ph.getImages();
            if (!images.empty()) {
                cout << "  images:\n";
                for (auto const& iter2: images) {
                    std::string const& name = iter2.first;
                    QPDFObjectHandle image = iter2.second;
                    QPDFObjectHandle dict = image.getDict();
                    int width = dict.getKey("/Width").getIntValueAsInt();
                    int height = dict.getKey("/Height").getIntValueAsInt();
                    cout << "    " << name << ": " << image.unparse() << ", " << width << " x "
                         << height << "\n";
                }
            }
        }

        cout << "  content:\n";
        for (auto& iter2: ph.getPageContents()) {
            cout << "    " << iter2.unparse() << "\n";
        }
    }
}